

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::Utils::program::build
          (program *this,shaderSource *compute_shader,shaderSource *fragment_shader,
          shaderSource *geometry_shader,shaderSource *tesselation_control_shader,
          shaderSource *tesselation_evaluation_shader,shaderSource *vertex_shader,
          GLchar **varying_names,GLuint n_varying_names,bool is_separable)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__to;
  char *__from;
  Functions *gl;
  bool is_separable_local;
  shaderSource *tesselation_evaluation_shader_local;
  shaderSource *tesselation_control_shader_local;
  shaderSource *geometry_shader_local;
  shaderSource *fragment_shader_local;
  shaderSource *compute_shader_local;
  program *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  bVar1 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::empty(&compute_shader->m_parts);
  if (!bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x91b9);
    this->m_compute_shader_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x45f3);
    compile(this,this->m_compute_shader_id,compute_shader);
  }
  bVar1 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::empty(&fragment_shader->m_parts);
  if (!bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
    this->m_fragment_shader_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x45fb);
    compile(this,this->m_fragment_shader_id,fragment_shader);
  }
  bVar1 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::empty(&geometry_shader->m_parts);
  if (!bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
    this->m_geometry_shader_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x4603);
    compile(this,this->m_geometry_shader_id,geometry_shader);
  }
  bVar1 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::empty(&tesselation_control_shader->m_parts);
  if (!bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
    this->m_tesselation_control_shader_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x460b);
    compile(this,this->m_tesselation_control_shader_id,tesselation_control_shader);
  }
  bVar1 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::empty(&tesselation_evaluation_shader->m_parts);
  if (!bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
    this->m_tesselation_evaluation_shader_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x4613);
    compile(this,this->m_tesselation_evaluation_shader_id,tesselation_evaluation_shader);
  }
  bVar1 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::empty(&vertex_shader->m_parts);
  if (!bVar1) {
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
    this->m_vertex_shader_id = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"CreateShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x461b);
    compile(this,this->m_vertex_shader_id,vertex_shader);
  }
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  this->m_program_object_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  __from = "CreateProgram";
  glu::checkError(dVar4,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4622);
  __to = extraout_RDX;
  if (n_varying_names != 0) {
    (**(code **)(lVar6 + 0x14c8))(this->m_program_object_id,n_varying_names,varying_names,0x8c8c);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    __from = "TransformFeedbackVaryings";
    glu::checkError(dVar4,"TransformFeedbackVaryings",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x4628);
    __to = extraout_RDX_00;
  }
  if (is_separable) {
    (**(code **)(lVar6 + 0x1058))(this->m_program_object_id,0x8258,1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    __from = "ProgramParameteri";
    glu::checkError(dVar4,"ProgramParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x462f);
    __to = extraout_RDX_01;
  }
  link(this,__from,__to);
  return;
}

Assistant:

void Utils::program::build(const shaderSource& compute_shader, const shaderSource& fragment_shader,
						   const shaderSource& geometry_shader, const shaderSource& tesselation_control_shader,
						   const shaderSource& tesselation_evaluation_shader, const shaderSource& vertex_shader,
						   const glw::GLchar* const* varying_names, glw::GLuint n_varying_names, bool is_separable)
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create shader objects and compile */
	if (false == compute_shader.m_parts.empty())
	{
		m_compute_shader_id = gl.createShader(ARB_COMPUTE_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_compute_shader_id, compute_shader);
	}

	if (false == fragment_shader.m_parts.empty())
	{
		m_fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_fragment_shader_id, fragment_shader);
	}

	if (false == geometry_shader.m_parts.empty())
	{
		m_geometry_shader_id = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_geometry_shader_id, geometry_shader);
	}

	if (false == tesselation_control_shader.m_parts.empty())
	{
		m_tesselation_control_shader_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_tesselation_control_shader_id, tesselation_control_shader);
	}

	if (false == tesselation_evaluation_shader.m_parts.empty())
	{
		m_tesselation_evaluation_shader_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_tesselation_evaluation_shader_id, tesselation_evaluation_shader);
	}

	if (false == vertex_shader.m_parts.empty())
	{
		m_vertex_shader_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

		compile(m_vertex_shader_id, vertex_shader);
	}

	/* Create program object */
	m_program_object_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	/* Set up captyured varyings' names */
	if (0 != n_varying_names)
	{
		gl.transformFeedbackVaryings(m_program_object_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");
	}

	/* Set separable parameter */
	if (true == is_separable)
	{
		gl.programParameteri(m_program_object_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ProgramParameteri");
	}

	/* Link program */
	link();
}